

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointSpline.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkPointSpline::ArchiveOUT(ChLinkPointSpline *this,ChArchiveOut *marchive)

{
  ChNameValue<std::shared_ptr<chrono::geometry::ChLine>_> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkPointSpline>(marchive);
  ChLinkLockLock::ArchiveOUT(&this->super_ChLinkLockLock,marchive);
  local_28._value = &this->trajectory_line;
  local_28._name = "trajectory_line";
  local_28._flags = '\0';
  ChArchiveOut::out<chrono::geometry::ChLine>(marchive,&local_28);
  return;
}

Assistant:

void ChLinkPointSpline::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkPointSpline>();

    // serialize parent class
    ChLinkLockLock::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(trajectory_line);
}